

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(ostream *os,char *s)

{
  char *local_20;
  char *c;
  char *s_local;
  ostream *os_local;
  
  std::operator<<(os,"\"");
  for (local_20 = s; *local_20 != '\0'; local_20 = local_20 + 1) {
    if (*local_20 == '\\') {
      std::operator<<(os,"\\\\");
    }
    else if (*local_20 == '\"') {
      std::operator<<(os,"\\\"");
    }
    else {
      std::operator<<(os,*local_20);
    }
  }
  std::operator<<(os,"\"");
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(std::ostream& os,
                                                       const char* s)
{
  // Write the given string to the stream with escaping to get it back
  // into CMake through the lexical scanner.
  os << "\"";
  for (const char* c = s; *c; ++c) {
    if (*c == '\\') {
      os << "\\\\";
    } else if (*c == '"') {
      os << "\\\"";
    } else {
      os << *c;
    }
  }
  os << "\"";
}